

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTransitionMatrices
          (BeagleCPUImpl<double,_1,_0> *this,int *matrixIndices,double *inMatrices,
          double *paddedValues,int count)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double *__src;
  double *__dest;
  int iVar4;
  ulong uVar5;
  
  if (0 < count) {
    uVar5 = 0;
    do {
      if (0 < this->kCategoryCount) {
        __dest = this->gTransitionMatrices[matrixIndices[uVar5]];
        __src = inMatrices +
                (long)((int)uVar5 * this->kStateCount * this->kStateCount) *
                (long)this->kCategoryCount;
        iVar3 = 0;
        do {
          uVar2 = this->kStateCount;
          if (0 < (int)uVar2) {
            iVar4 = 0;
            do {
              memcpy(__dest,__src,(ulong)uVar2 << 3);
              iVar1 = this->kStateCount;
              __dest[iVar1] = paddedValues[uVar5];
              __dest = __dest + this->kTransPaddedStateCount;
              __src = __src + iVar1;
              iVar4 = iVar4 + 1;
              uVar2 = this->kStateCount;
            } while (iVar4 < (int)uVar2);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < this->kCategoryCount);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)count);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrices(const int* matrixIndices,
                                                             const double* inMatrices,
                                                             const double* paddedValues,
                                                             int count) {
    for (int k = 0; k < count; k++) {
        const double* inMatrix = inMatrices + k*kStateCount*kStateCount*kCategoryCount;
        int matrixIndex = matrixIndices[k];

if (T_PAD != 0) {
        const double* offsetInMatrix = inMatrix;
        REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
        for(int i = 0; i < kCategoryCount; i++) {
            for(int j = 0; j < kStateCount; j++) {
                beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
                offsetBeagleMatrix[kStateCount] = paddedValues[k];
                offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
                offsetInMatrix += kStateCount;
            }
        }
} else {
        beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                     kMatrixSize * kCategoryCount);
}
    }

    return BEAGLE_SUCCESS;
}